

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseExternalSubset(xmlParserCtxtPtr ctxt,xmlChar *ExternalID,xmlChar *SystemID)

{
  xmlChar *pxVar1;
  ulong uVar2;
  xmlDocPtr pxVar3;
  bool bVar4;
  uint cons;
  xmlChar *check;
  xmlCharEncoding enc;
  xmlChar start [4];
  xmlChar *SystemID_local;
  xmlChar *ExternalID_local;
  xmlParserCtxtPtr ctxt_local;
  
  _enc = SystemID;
  xmlDetectSAX2(ctxt);
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if ((ctxt->encoding == (xmlChar *)0x0) && (3 < (long)ctxt->input->end - (long)ctxt->input->cur)) {
    check._4_1_ = *ctxt->input->cur;
    check._5_1_ = ctxt->input->cur[1];
    check._6_1_ = ctxt->input->cur[2];
    check._7_1_ = ctxt->input->cur[3];
    check._0_4_ = xmlDetectCharEncoding((uchar *)((long)&check + 4),4);
    if ((xmlCharEncoding)check != XML_CHAR_ENCODING_NONE) {
      xmlSwitchEncoding(ctxt,(xmlCharEncoding)check);
    }
  }
  if (((((((ctxt->mlType == XML_TYPE_XML) && (*ctxt->input->cur == '<')) &&
         (ctxt->input->cur[1] == '?')) &&
        ((ctxt->input->cur[2] == 'x' && (ctxt->input->cur[3] == 'm')))) &&
       (ctxt->input->cur[4] == 'l')) ||
      (((ctxt->mlType == XML_TYPE_SML && (*ctxt->input->cur == '?')) &&
       ((ctxt->input->cur[1] == 'x' &&
        ((ctxt->input->cur[2] == 'm' && (ctxt->input->cur[3] == 'l')))))))) &&
     (xmlParseTextDecl(ctxt), ctxt->errNo == 0x20)) {
    xmlHaltParser(ctxt);
  }
  else {
    if (ctxt->myDoc == (xmlDocPtr)0x0) {
      pxVar3 = xmlNewDoc("1.0");
      ctxt->myDoc = pxVar3;
      if (ctxt->myDoc == (xmlDocPtr)0x0) {
        xmlErrMemory(ctxt,"New Doc failed");
        return;
      }
      ctxt->myDoc->properties = 0x40;
    }
    if ((ctxt->myDoc != (xmlDocPtr)0x0) && (ctxt->myDoc->intSubset == (_xmlDtd *)0x0)) {
      xmlCreateIntSubset(ctxt->myDoc,(xmlChar *)0x0,ExternalID,_enc);
    }
    ctxt->instate = XML_PARSER_DTD;
    ctxt->external = 1;
    xmlSkipBlankChars(ctxt);
    do {
      if (((((ctxt->mlType != XML_TYPE_XML) || (*ctxt->input->cur != '<')) ||
           (bVar4 = true, ctxt->input->cur[1] != '?')) &&
          (((ctxt->mlType != XML_TYPE_SML || (bVar4 = true, *ctxt->input->cur != '?')) &&
           ((ctxt->mlType != XML_TYPE_XML ||
            ((*ctxt->input->cur != '<' || (bVar4 = true, ctxt->input->cur[1] != '!')))))))) &&
         ((ctxt->mlType != XML_TYPE_SML || (bVar4 = true, *ctxt->input->cur != '!')))) {
        bVar4 = *ctxt->input->cur == '%';
      }
      if (!bVar4) goto LAB_00184975;
      pxVar1 = ctxt->input->cur;
      uVar2 = ctxt->input->consumed;
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      if (((((ctxt->mlType == XML_TYPE_XML) && (*ctxt->input->cur == '<')) &&
           (ctxt->input->cur[1] == '!')) && (ctxt->input->cur[2] == '[')) ||
         (((ctxt->mlType == XML_TYPE_SML && (*ctxt->input->cur == '!')) &&
          (ctxt->input->cur[1] == '[')))) {
        xmlParseConditionalSections(ctxt);
      }
      else {
        xmlParseMarkupDecl(ctxt);
      }
      xmlSkipBlankChars(ctxt);
    } while ((ctxt->input->cur != pxVar1) || ((uVar2 & 0xffffffff) != ctxt->input->consumed));
    xmlFatalErr(ctxt,XML_ERR_EXT_SUBSET_NOT_FINISHED,(char *)0x0);
LAB_00184975:
    if (*ctxt->input->cur != '\0') {
      xmlFatalErr(ctxt,XML_ERR_EXT_SUBSET_NOT_FINISHED,(char *)0x0);
    }
  }
  return;
}

Assistant:

void
xmlParseExternalSubset(xmlParserCtxtPtr ctxt, const xmlChar *ExternalID,
                       const xmlChar *SystemID) {
    xmlDetectSAX2(ctxt);
    GROW;

    if ((ctxt->encoding == NULL) &&
        (ctxt->input->end - ctxt->input->cur >= 4)) {
        xmlChar start[4];
	xmlCharEncoding enc;

	start[0] = RAW;
	start[1] = NXT(1);
	start[2] = NXT(2);
	start[3] = NXT(3);
	enc = xmlDetectCharEncoding(start, 4);
	if (enc != XML_CHAR_ENCODING_NONE)
	    xmlSwitchEncoding(ctxt, enc);
    }

    if (CMP5_MLI(CUR_PTR, '<', '?', 'x', 'm', 'l')) {
	xmlParseTextDecl(ctxt);
	if (ctxt->errNo == XML_ERR_UNSUPPORTED_ENCODING) {
	    /*
	     * The XML REC instructs us to stop parsing right here
	     */
	    xmlHaltParser(ctxt);
	    return;
	}
    }
    if (ctxt->myDoc == NULL) {
        ctxt->myDoc = xmlNewDoc(BAD_CAST "1.0");
	if (ctxt->myDoc == NULL) {
	    xmlErrMemory(ctxt, "New Doc failed");
	    return;
	}
	ctxt->myDoc->properties = XML_DOC_INTERNAL;
    }
    if ((ctxt->myDoc != NULL) && (ctxt->myDoc->intSubset == NULL))
        xmlCreateIntSubset(ctxt->myDoc, NULL, ExternalID, SystemID);

    ctxt->instate = XML_PARSER_DTD;
    ctxt->external = 1;
    SKIP_BLANKS;
    while ((CMP2_MLI(CUR_PTR, '<', '?')) ||
           (CMP2_MLI(CUR_PTR, '<', '!')) ||
	   (RAW == '%')) {
	const xmlChar *check = CUR_PTR;
	unsigned int cons = ctxt->input->consumed;

	GROW;
        if (CMP3_MLI(CUR_PTR, '<', '!', '[')) {
	    xmlParseConditionalSections(ctxt);
	} else
	    xmlParseMarkupDecl(ctxt);
        SKIP_BLANKS;

	if ((CUR_PTR == check) && (cons == ctxt->input->consumed)) {
	    xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
	    break;
	}
    }

    if (RAW != 0) {
	xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
    }

}